

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FullSegment.hpp
# Opt level: O1

void __thiscall
cppjieba::FullSegment::Cut
          (FullSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  pointer *ppWVar1;
  size_t sVar2;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *ppVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  iterator __position;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  WordRange wr;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> dags;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> tRes;
  WordRange local_178;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> local_168;
  const_iterator local_150;
  undefined1 local_148 [256];
  undefined1 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  memset(local_148,0,0x100);
  local_40 = 0;
  local_38 = 0x10;
  local_48 = local_148;
  if (this->dictTrie_ == (DictTrie *)0x0) {
    __assert_fail("dictTrie_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/FullSegment.hpp"
                  ,0x3e,
                  "void cppjieba::FullSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &) const"
                 );
  }
  local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Trie::Find(this->dictTrie_->trie_,begin,end,&local_168,0x200);
  if (local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
    uVar6 = 0;
    uVar8 = 0;
    do {
      sVar2 = local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6].nexts.size_;
      if (sVar2 != 0) {
        local_150 = begin + uVar6;
        bVar11 = sVar2 != 1;
        lVar7 = 8;
        uVar10 = 0;
        do {
          ppVar3 = local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar6].nexts.ptr_;
          uVar4 = *(ulong *)((long)ppVar3 + lVar7 + -8);
          if ((ulong)(((long)local_168.
                             super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_168.
                             super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7063e7063e7063e7)
              <= uVar4) {
            __assert_fail("nextoffset < dags.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/FullSegment.hpp"
                          ,0x44,
                          "void cppjieba::FullSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &) const"
                         );
          }
          lVar5 = *(long *)((long)&ppVar3->first + lVar7);
          if (lVar5 == 0) {
            if (!bVar11 && uVar9 <= uVar6) {
              local_178.right = begin + uVar4;
              local_178.left = local_150;
              __position._M_current =
                   (res->
                   super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current !=
                  (res->
                  super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0010dc50;
              std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
              _M_realloc_insert<cppjieba::WordRange_const&>
                        ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,
                         __position,&local_178);
            }
          }
          else {
            uVar8 = *(ulong *)(lVar5 + 0x48);
            if ((1 < uVar8) || (!bVar11 && uVar9 <= uVar6)) {
              local_178.right = begin + uVar4;
              local_178.left = local_150;
              __position._M_current =
                   (res->
                   super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (res->
                  super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
                _M_realloc_insert<cppjieba::WordRange_const&>
                          ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,
                           __position,&local_178);
              }
              else {
LAB_0010dc50:
                local_178.right = begin + uVar4;
                local_178.left = local_150;
                (__position._M_current)->left = local_150;
                (__position._M_current)->right = local_178.right;
                ppWVar1 = &(res->
                           super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppWVar1 = *ppWVar1 + 1;
              }
            }
          }
          if (uVar9 < uVar8 + uVar6) {
            uVar9 = uVar8 + uVar6;
          }
          uVar10 = uVar10 + 1;
          lVar7 = lVar7 + 0x10;
          bVar11 = true;
        } while (uVar10 < local_168.
                          super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6].nexts.size_);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)(((long)local_168.
                                    super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_168.
                                    super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x7063e7063e7063e7));
  }
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::~vector(&local_168);
  if (local_48 != local_148) {
    free(local_48);
  }
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<WordRange>& res) const {
    // resut of searching in trie tree
    LocalVector<pair<size_t, const DictUnit*> > tRes;

    // max index of res's words
    size_t maxIdx = 0;

    // always equals to (uItr - begin)
    size_t uIdx = 0;

    // tmp variables
    size_t wordLen = 0;
    assert(dictTrie_);
    vector<struct Dag> dags;
    dictTrie_->Find(begin, end, dags);
    for (size_t i = 0; i < dags.size(); i++) {
      for (size_t j = 0; j < dags[i].nexts.size(); j++) {
        size_t nextoffset = dags[i].nexts[j].first;
        assert(nextoffset < dags.size());
        const DictUnit* du = dags[i].nexts[j].second;
        if (du == NULL) {
          if (dags[i].nexts.size() == 1 && maxIdx <= uIdx) {
            WordRange wr(begin + i, begin + nextoffset);
            res.push_back(wr);
          }
        } else {
          wordLen = du->word.size();
          if (wordLen >= 2 || (dags[i].nexts.size() == 1 && maxIdx <= uIdx)) {
            WordRange wr(begin + i, begin + nextoffset);
            res.push_back(wr);
          }
        }
        maxIdx = uIdx + wordLen > maxIdx ? uIdx + wordLen : maxIdx;
      }
      uIdx++;
    }
  }